

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message_type.cpp
# Opt level: O2

void __thiscall
BrokerMessageType_MaxLengthIteratorRange_Test::~BrokerMessageType_MaxLengthIteratorRange_Test
          (BrokerMessageType_MaxLengthIteratorRange_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (BrokerMessageType, MaxLengthIteratorRange) {
    std::string long_payload;
    constexpr auto num = std::size_t{pstore::brokerface::message_type::payload_chars};
    generate (std::back_inserter (long_payload), num);

    pstore::brokerface::message_type const actual{0, 0, 1, std::begin (long_payload),
                                                  std::end (long_payload)};

    pstore::brokerface::message_type::payload_type expected_payload{{'\0'}};
    generate (std::begin (expected_payload), expected_payload.size ());
    EXPECT_THAT (actual.payload, ::testing::ContainerEq (expected_payload));
}